

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::ComputeV1
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *v1)

{
  _func_int **pp_Var1;
  bool bVar2;
  TPZDohrSubstruct<long_double> *this_00;
  reference pTVar3;
  TPZDohrSubstruct<long_double> *v1_local_00;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  TPZFMatrix<long_double> CoarseSolution_local;
  TPZFMatrix<long_double> v1_local;
  TPZFMatrix<long_double> CoarseSolution;
  TPZFMatrix<long_double> CoarseResidual_local;
  TPZFMatrix<long_double> xloc;
  int isub;
  const_iterator it;
  TPZFMatrix<long_double> CoarseResidual;
  undefined4 in_stack_fffffffffffffbd8;
  DecomposeType in_stack_fffffffffffffbdc;
  TPZDohrSubstruct<long_double> *in_stack_fffffffffffffbe0;
  TPZFMatrix<long_double> *in_stack_fffffffffffffc08;
  TPZDohrSubstruct<long_double> *in_stack_fffffffffffffc10;
  TPZDohrAssembly<long_double> *in_stack_fffffffffffffc18;
  _Self local_2a0;
  _List_node_base *local_298;
  undefined1 local_290 [144];
  _List_node_base *local_200;
  _Self local_d8;
  _List_node_base *local_d0;
  int local_c4;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_> local_c0 [3];
  undefined1 local_a8 [152];
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  TPZBaseMatrix::Cols(in_RSI);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_RDI,(int64_t)in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10);
  TPZFMatrix<long_double>::Zero((TPZFMatrix<long_double> *)in_stack_fffffffffffffbe0);
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::_List_const_iterator
            (local_c0);
  local_c4 = 0;
  local_d0 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
             ::begin((list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_c0[0]._M_node = local_d0;
  while( true ) {
    local_d8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
         ::end((list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar2 = std::operator!=(local_c0,&local_d8);
    if (!bVar2) break;
    TPZFMatrix<long_double>::TPZFMatrix((TPZFMatrix<long_double> *)in_stack_fffffffffffffc10);
    TPZFMatrix<long_double>::TPZFMatrix((TPZFMatrix<long_double> *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc18 =
         TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<long_double>::Extract
              ((TPZDohrAssembly<long_double> *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<long_double> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    pTVar3 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::operator*
                       ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_> *)
                        in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffc10 = TPZAutoPointer<TPZDohrSubstruct<long_double>_>::operator->(pTVar3);
    TPZDohrSubstruct<long_double>::Contribute_rc_local
              (in_stack_fffffffffffffbe0,
               (TPZFMatrix<long_double> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (TPZFMatrix<long_double> *)0x1f7a756);
    in_stack_fffffffffffffc08 =
         (TPZFMatrix<long_double> *)
         TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<long_double>::AssembleCoarse
              ((TPZDohrAssembly<long_double> *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<long_double> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f7a79d);
    TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f7a7aa);
    local_200 = (_List_node_base *)
                std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::
                operator++(local_c0,0);
    local_c4 = local_c4 + 1;
  }
  TPZStepSolver<long_double>::SetDirect
            ((TPZStepSolver<long_double> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
  TPZBaseMatrix::Cols(local_10);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_RDI,(int64_t)in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10);
  pp_Var1 = (in_RDI->fPivot).super_TPZVec<int>._vptr_TPZVec;
  (**(code **)(*pp_Var1 + 0x58))(pp_Var1,local_a8,local_290,0);
  local_c4 = 0;
  local_298 = (_List_node_base *)
              std::__cxx11::
              list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
              ::begin((list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_c0[0]._M_node = local_298;
  while( true ) {
    local_2a0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
         ::end((list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar2 = std::operator!=(local_c0,&local_2a0);
    if (!bVar2) break;
    TPZFMatrix<long_double>::TPZFMatrix((TPZFMatrix<long_double> *)in_stack_fffffffffffffc10);
    TPZFMatrix<long_double>::TPZFMatrix((TPZFMatrix<long_double> *)in_stack_fffffffffffffc10);
    this_00 = (TPZDohrSubstruct<long_double> *)
              TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->
                        ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)
                         &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<long_double>::ExtractCoarse
              ((TPZDohrAssembly<long_double> *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<long_double> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    pTVar3 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::operator*
                       ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_> *)
                        in_stack_fffffffffffffbe0);
    v1_local_00 = TPZAutoPointer<TPZDohrSubstruct<long_double>_>::operator->(pTVar3);
    TPZDohrSubstruct<long_double>::Contribute_v1_local
              (this_00,(TPZFMatrix<long_double> *)v1_local_00,
               (TPZFMatrix<long_double> *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (TPZDohrSubstruct<long_double> *)
         TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<long_double>::Assemble
              ((TPZDohrAssembly<long_double> *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<long_double> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f7a9db);
    TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f7a9e8);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>::operator++
              (local_c0,0);
    local_c4 = local_c4 + 1;
  }
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f7aa78);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f7aa85);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV1(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v1) const
{
	/* Computing r(c) */
	TPZFMatrix<TVar> CoarseResidual(fNumCoarse,x.Cols());
	CoarseResidual.Zero();
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++, isub++) {
		TPZFMatrix<TVar> xloc, CoarseResidual_local;
		fAssemble->Extract(isub,x,xloc);
		//		(*it)->LoadWeightedResidual(xloc);
		(*it)->Contribute_rc_local(xloc,CoarseResidual_local);
		fAssemble->AssembleCoarse(isub,CoarseResidual_local,CoarseResidual);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseResidual.Print("Coarse Residual",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	/* Computing K(c)_inverted*r(c) and stores it in "product" */
	fCoarse->SetDirect(ELDLt);
	//Dado global
	TPZFMatrix<TVar> CoarseSolution(fNumCoarse,x.Cols());
	fCoarse->Solve(CoarseResidual,CoarseSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseSolution.Print("CoarseSolution",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// Gerenciamento Global->Local sobre o product
		//product é administrado pelo DM mas permanece no processador 0
		// tarefa separada, expansao da solucao coarse
		TPZFMatrix<TVar> v1_local,CoarseSolution_local;
		fAssemble->ExtractCoarse(isub,CoarseSolution,CoarseSolution_local);
		(*it)->Contribute_v1_local(v1_local,CoarseSolution_local);
		
		fAssemble->Assemble(isub,v1_local,v1);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v1.Print("v1 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}